

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

char * get_refdir(char *d)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  char *local_40;
  char *p;
  char *pwd;
  char *tried;
  char *buff;
  size_t buff_size;
  size_t tried_size;
  char *d_local;
  
  __s = (char *)calloc(0x1000,1);
  if (__s == (char *)0x0) {
    fprintf(_stderr,"Unable to allocate memory\n");
    exit(1);
  }
  pcVar1 = (char *)calloc(0x2000,1);
  if (pcVar1 == (char *)0x0) {
    fprintf(_stderr,"Unable to allocate memory\n");
    exit(1);
  }
  if (d == (char *)0x0) {
    p = getcwd((char *)0x0,0);
    while (sVar2 = strlen(p), *(char *)((long)p + (sVar2 - 1)) == '\n') {
      sVar2 = strlen(p);
      *(undefined1 *)((long)p + (sVar2 - 1)) = 0;
    }
    snprintf(__s,0x1000,"%s",p);
    local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
    if (local_40 == (char *)0x0) {
      sVar2 = strlen(pcVar1);
      strncat(pcVar1,__s,0x1fff - sVar2);
      sVar2 = strlen(pcVar1);
      strncat(pcVar1,"\n",0x1fff - sVar2);
      snprintf(__s,0x1000,"%s/test",p);
      local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
      if (local_40 == (char *)0x0) {
        sVar2 = strlen(pcVar1);
        strncat(pcVar1,__s,0x1fff - sVar2);
        sVar2 = strlen(pcVar1);
        strncat(pcVar1,"\n",0x1fff - sVar2);
        snprintf(__s,0x1000,"%s/%s/test",p,"bsdcpio");
        local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
        if (local_40 == (char *)0x0) {
          sVar2 = strlen(pcVar1);
          strncat(pcVar1,__s,0x1fff - sVar2);
          sVar2 = strlen(pcVar1);
          strncat(pcVar1,"\n",0x1fff - sVar2);
          snprintf(__s,0x1000,"%s/%s/test",p,"cpio");
          local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
          if (local_40 == (char *)0x0) {
            sVar2 = strlen(pcVar1);
            strncat(pcVar1,__s,0x1fff - sVar2);
            sVar2 = strlen(pcVar1);
            strncat(pcVar1,"\n",0x1fff - sVar2);
            if (*(long *)p != 0x6a626f2f7273752f) {
LAB_001074e6:
              printf("Unable to locate known reference file %s\n","test_option_f.cpio.uu");
              printf("  Checked following directories:\n%s\n",pcVar1);
              printf("Use -r option to specify full path to reference directory\n");
              exit(1);
            }
            snprintf(__s,0x1000,"%s",(long *)((long)p + 8));
            local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
            if (local_40 == (char *)0x0) {
              sVar2 = strlen(pcVar1);
              strncat(pcVar1,__s,0x1fff - sVar2);
              sVar2 = strlen(pcVar1);
              strncat(pcVar1,"\n",0x1fff - sVar2);
              snprintf(__s,0x1000,"%s/test",(long *)((long)p + 8));
              local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
              if (local_40 == (char *)0x0) {
                sVar2 = strlen(pcVar1);
                strncat(pcVar1,__s,0x1fff - sVar2);
                sVar2 = strlen(pcVar1);
                strncat(pcVar1,"\n",0x1fff - sVar2);
                goto LAB_001074e6;
              }
            }
          }
        }
      }
    }
  }
  else {
    p = (char *)0x0;
    snprintf(__s,0x1000,"%s",d);
    local_40 = slurpfile((size_t *)0x0,"%s/%s",__s,"test_option_f.cpio.uu");
    if (local_40 == (char *)0x0) {
      sVar2 = strlen(pcVar1);
      strncat(pcVar1,__s,0x1fff - sVar2);
      sVar2 = strlen(pcVar1);
      strncat(pcVar1,"\n",0x1fff - sVar2);
      goto LAB_001074e6;
    }
  }
  free(local_40);
  free(p);
  free(pcVar1);
  pcVar1 = strdup(__s);
  free(__s);
  return pcVar1;
}

Assistant:

static char *
get_refdir(const char *d)
{
	size_t tried_size, buff_size;
	char *buff, *tried, *pwd = NULL, *p = NULL;

#ifdef PATH_MAX
	buff_size = PATH_MAX;
#else
	buff_size = 8192;
#endif
	buff = calloc(buff_size, 1);
	if (buff == NULL) {
		fprintf(stderr, "Unable to allocate memory\n");
		exit(1);
	}

	/* Allocate a buffer to hold the various directories we checked. */
	tried_size = buff_size * 2;
	tried = calloc(tried_size, 1);
	if (tried == NULL) {
		fprintf(stderr, "Unable to allocate memory\n");
		exit(1);
	}

	/* If a dir was specified, try that */
	if (d != NULL) {
		pwd = NULL;
		snprintf(buff, buff_size, "%s", d);
		p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
		if (p != NULL) goto success;
		strncat(tried, buff, tried_size - strlen(tried) - 1);
		strncat(tried, "\n", tried_size - strlen(tried) - 1);
		goto failure;
	}

	/* Get the current dir. */
#if defined(PATH_MAX) && !defined(__GLIBC__)
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

	/* Look for a known file. */
	snprintf(buff, buff_size, "%s", pwd);
	p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
	if (p != NULL) goto success;
	strncat(tried, buff, tried_size - strlen(tried) - 1);
	strncat(tried, "\n", tried_size - strlen(tried) - 1);

	snprintf(buff, buff_size, "%s/test", pwd);
	p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
	if (p != NULL) goto success;
	strncat(tried, buff, tried_size - strlen(tried) - 1);
	strncat(tried, "\n", tried_size - strlen(tried) - 1);

#if defined(LIBRARY)
	snprintf(buff, buff_size, "%s/%s/test", pwd, LIBRARY);
#else
	snprintf(buff, buff_size, "%s/%s/test", pwd, PROGRAM);
#endif
	p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
	if (p != NULL) goto success;
	strncat(tried, buff, tried_size - strlen(tried) - 1);
	strncat(tried, "\n", tried_size - strlen(tried) - 1);

#if defined(PROGRAM_ALIAS)
	snprintf(buff, buff_size, "%s/%s/test", pwd, PROGRAM_ALIAS);
	p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
	if (p != NULL) goto success;
	strncat(tried, buff, tried_size - strlen(tried) - 1);
	strncat(tried, "\n", tried_size - strlen(tried) - 1);
#endif

	if (memcmp(pwd, "/usr/obj", 8) == 0) {
		snprintf(buff, buff_size, "%s", pwd + 8);
		p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
		if (p != NULL) goto success;
		strncat(tried, buff, tried_size - strlen(tried) - 1);
		strncat(tried, "\n", tried_size - strlen(tried) - 1);

		snprintf(buff, buff_size, "%s/test", pwd + 8);
		p = slurpfile(NULL, "%s/%s", buff, KNOWNREF);
		if (p != NULL) goto success;
		strncat(tried, buff, tried_size - strlen(tried) - 1);
		strncat(tried, "\n", tried_size - strlen(tried) - 1);
	}

failure:
	printf("Unable to locate known reference file %s\n", KNOWNREF);
	printf("  Checked following directories:\n%s\n", tried);
	printf("Use -r option to specify full path to reference directory\n");
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
	DebugBreak();
#endif
	exit(1);

success:
	free(p);
	free(pwd);
	free(tried);

	/* Copy result into a fresh buffer to reduce memory usage. */
	p = strdup(buff);
	free(buff);
	return p;
}